

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O3

void __thiscall
IgnoredUtestShell::runOneTest(IgnoredUtestShell *this,TestPlugin *plugin,TestResult *result)

{
  int iVar1;
  code *pcVar2;
  IgnoredUtestShell *local_38;
  TestPlugin *local_30;
  TestResult *local_28;
  
  if ((this->super_UtestShell).field_0x32 == '\x01') {
    (this->super_UtestShell).hasFailed_ = false;
    (*result->_vptr_TestResult[9])(result);
    local_38 = this;
    local_30 = plugin;
    local_28 = result;
    iVar1 = (*(this->super_UtestShell)._vptr_UtestShell[0x1f])(this);
    pcVar2 = helperDoRunOneTestInCurrentProcess;
    if ((char)iVar1 != '\0') {
      pcVar2 = helperDoRunOneTestSeperateProcess;
    }
    (*PlatformSpecificSetJmp)(pcVar2,&local_38);
    return;
  }
  (*result->_vptr_TestResult[0xc])(result);
  return;
}

Assistant:

void IgnoredUtestShell::runOneTest(TestPlugin* plugin, TestResult& result)
{
    if (runIgnored_)
    {
        UtestShell::runOneTest(plugin, result);
        return;
    }

    result.countIgnored();
}